

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thingdef_codeptr.cpp
# Opt level: O2

int AF_A_JumpIfArmorType(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  VM_UBYTE VVar1;
  int iVar2;
  bool bVar3;
  AInventory *pAVar4;
  int iVar5;
  char *pcVar6;
  FState *state;
  void *val;
  AActor *this;
  FName local_34;
  
  if (numparam < 1) {
    pcVar6 = "(paramnum) < numparam";
    goto LAB_005b2f92;
  }
  if ((param->field_0).field_3.Type == '\x03') {
    this = (AActor *)(param->field_0).field_1.a;
    if ((param->field_0).field_1.atag == 1) {
      if (this != (AActor *)0x0) {
        bVar3 = DObject::IsKindOf((DObject *)this,AActor::RegistrationInfo.MyClass);
        if (!bVar3) {
          pcVar6 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_005b2f92;
        }
        goto LAB_005b2e5b;
      }
    }
    else if (this != (AActor *)0x0) goto LAB_005b2f82;
    this = (AActor *)0x0;
LAB_005b2e5b:
    if (numparam == 1) {
      pcVar6 = "(paramnum) < numparam";
    }
    else {
      if (param[1].field_0.field_3.Type == '\0') {
        if ((uint)numparam < 3) {
          pcVar6 = "(paramnum) < numparam";
        }
        else {
          if ((param[2].field_0.field_3.Type == '\x03') &&
             (val = param[2].field_0.field_1.a,
             val == (void *)0x0 || param[2].field_0.field_1.atag == 7)) {
            iVar2 = param[1].field_0.i;
            iVar5 = 1;
            if (numparam != 3) {
              VVar1 = param[3].field_0.field_3.Type;
              if (VVar1 == '\0') {
                iVar5 = param[3].field_0.i;
              }
              else if (VVar1 != 0xff) {
                __assert_fail("param[paramnum].Type == REGT_INT",
                              "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_codeptr.cpp"
                              ,0x54e,
                              "int AF_A_JumpIfArmorType(VMFrameStack *, VMValue *, int, VMReturn *, int)"
                             );
              }
            }
            local_34.Index = 0x5b;
            pAVar4 = AActor::FindInventory(this,&local_34);
            if (((pAVar4 == (AInventory *)0x0) ||
                (*(int *)((long)&pAVar4[1].super_AActor.super_DThinker.super_DObject.ObjNext + 4) !=
                 iVar2)) || (pAVar4->Amount < iVar5)) {
              if (numret < 1) {
                return 0;
              }
              if (ret == (VMReturn *)0x0) {
                __assert_fail("ret != NULL",
                              "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_codeptr.cpp"
                              ,0x556,
                              "int AF_A_JumpIfArmorType(VMFrameStack *, VMValue *, int, VMReturn *, int)"
                             );
              }
              val = (void *)0x0;
            }
            else {
              if (numret < 1) {
                return 0;
              }
              if (ret == (VMReturn *)0x0) {
                __assert_fail("ret != NULL",
                              "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_codeptr.cpp"
                              ,0x554,
                              "int AF_A_JumpIfArmorType(VMFrameStack *, VMValue *, int, VMReturn *, int)"
                             );
              }
            }
            VMReturn::SetPointer(ret,val,7);
            return 1;
          }
          pcVar6 = 
          "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATE || param[paramnum].a == NULL)"
          ;
        }
        __assert_fail(pcVar6,
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_codeptr.cpp"
                      ,0x54d,
                      "int AF_A_JumpIfArmorType(VMFrameStack *, VMValue *, int, VMReturn *, int)");
      }
      pcVar6 = "param[paramnum].Type == REGT_INT";
    }
    __assert_fail(pcVar6,
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_codeptr.cpp"
                  ,0x54c,"int AF_A_JumpIfArmorType(VMFrameStack *, VMValue *, int, VMReturn *, int)"
                 );
  }
LAB_005b2f82:
  pcVar6 = 
  "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
  ;
LAB_005b2f92:
  __assert_fail(pcVar6,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_codeptr.cpp"
                ,0x54b,"int AF_A_JumpIfArmorType(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION_PARAMS(AActor, A_JumpIfArmorType)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_NAME	 (type);
	PARAM_STATE	 (label);
	PARAM_INT_OPT(amount) { amount = 1; }

	ABasicArmor *armor = (ABasicArmor *)self->FindInventory(NAME_BasicArmor);

	if (armor && armor->ArmorType == type && armor->Amount >= amount)
	{
		ACTION_RETURN_STATE(label);
	}
	ACTION_RETURN_STATE(NULL);
}